

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::CloneFileContent(string *source,string *destination)

{
  uint __fd;
  int __fd_00;
  int iVar1;
  char *pcVar2;
  int out;
  int in;
  string *destination_local;
  string *source_local;
  Status status;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __fd = open(pcVar2,0);
  if ((int)__fd < 0) {
    source_local = (string *)Status::POSIX_errno();
  }
  else {
    RemoveFile(destination);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __fd_00 = open(pcVar2,0x241,0x180);
    if (__fd_00 < 0) {
      source_local = (string *)Status::POSIX_errno();
      close(__fd);
    }
    else {
      source_local = (string *)Status::Success();
      iVar1 = ioctl(__fd_00,0x40049409,(ulong)__fd);
      if (iVar1 < 0) {
        source_local = (string *)Status::POSIX_errno();
      }
      close(__fd);
      close(__fd_00);
    }
  }
  return (Status)source_local;
}

Assistant:

Status SystemTools::CloneFileContent(std::string const& source,
                                     std::string const& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return Status::POSIX_errno();
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    Status status = Status::POSIX_errno();
    close(in);
    return status;
  }

  Status status = Status::Success();
  if (ioctl(out, FICLONE, in) < 0) {
    status = Status::POSIX_errno();
  }
  close(in);
  close(out);

  return status;
#elif defined(__APPLE__) &&                                                   \
  defined(KWSYS_SYSTEMTOOLS_HAVE_MACOS_COPYFILE_CLONE)
  // NOTE: we cannot use `clonefile` as the {a,c,m}time for the file needs to
  // be updated by `copy_file_if_different` and `copy_file`.
  if (copyfile(source.c_str(), destination.c_str(), nullptr,
               COPYFILE_METADATA | COPYFILE_CLONE) < 0) {
    return Status::POSIX_errno();
  }
#  if KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, destination.c_str(), nullptr, 0) < 0) {
    return Status::POSIX_errno();
  }
#  else
  // fall back to utimes
  if (utimes(destination.c_str(), nullptr) < 0) {
    return Status::POSIX_errno();
  }
#  endif
  return Status::Success();
#else
  (void)source;
  (void)destination;
  return Status::POSIX(ENOSYS);
#endif
}